

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

int anon_unknown.dwarf_747b::RtMidi_getcompiledapibyname(lua_State *L)

{
  Api AVar1;
  long lVar2;
  size_t sz;
  string local_40;
  long local_20;
  
  lVar2 = luaL_checklstring(L,1,&local_20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,lVar2,local_20 + lVar2);
  AVar1 = RtMidi::getCompiledApiByName(&local_40);
  lua_pushinteger(L,AVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return 1;
}

Assistant:

int RtMidi_getcompiledapibyname(lua_State *L) {
	std::size_t sz;
	const char *str = luaL_checklstring(L, 1, &sz);
	lua_pushinteger(L, RtMidi::getCompiledApiByName({str, sz}));
	return 1;
}